

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelControl.cpp
# Opt level: O0

void trackerboy::ChannelControl<(trackerboy::ChType)3>::clear(IApuIo *apu)

{
  byte bVar1;
  int iVar2;
  ChType e;
  byte local_12;
  uint8_t nr51;
  uint8_t i;
  uint8_t regno;
  IApuIo *apu_local;
  
  for (local_12 = 0; local_12 != 5; local_12 = local_12 + 1) {
    (*apu->_vptr_IApuIo[1])(apu,(ulong)(byte)(local_12 + 0x1f),0,(ulong)(local_12 + 0x1f));
  }
  e = 0x25;
  iVar2 = (**apu->_vptr_IApuIo)();
  bVar1 = operator+((trackerboy *)0x3,e);
  (*apu->_vptr_IApuIo[1])(apu,0x25,(ulong)(byte)((byte)iVar2 & ~(byte)(0x11 << (bVar1 & 0x1f))));
  return;
}

Assistant:

void ChannelControl<ch>::clear(IApuIo &apu) noexcept {
    // clear registers
    constexpr uint8_t regno = IApuIo::REG_NR10 + (+ch * GB_CHANNEL_REGS);
    for (uint8_t i = 0; i != GB_CHANNEL_REGS; ++i) {
        apu.writeRegister(regno + i, 0);
    }
    // clear terminals for the channel
    auto nr51 = apu.readRegister(IApuIo::REG_NR51);
    nr51 &= ~((uint8_t)0x11 << (+ch));
    apu.writeRegister(IApuIo::REG_NR51, nr51);
}